

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O3

void __thiscall FShaderLayer::Update(FShaderLayer *this,float diff)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  
  do {
    FCycler::Update(&this->r,diff);
    FCycler::Update(&this->g,diff);
    FCycler::Update(&this->b,diff);
    FCycler::Update(&this->alpha,diff);
    FCycler::Update(&this->vectorY,diff);
    FCycler::Update(&this->vectorX,diff);
    FCycler::Update(&this->scaleX,diff);
    FCycler::Update(&this->scaleY,diff);
    FCycler::Update(&this->adjustX,diff);
    FCycler::Update(&this->adjustY,diff);
    FCycler::Update(&this->srcFactor,diff);
    FCycler::Update(&this->dstFactor,diff);
    uVar1 = this->offsetX;
    uVar2 = this->offsetY;
    fVar3 = (float)uVar1 + (this->vectorX).m_current * diff;
    fVar4 = (float)uVar2 + (this->vectorY).m_current * diff;
    fVar3 = (float)(~-(uint)(fVar3 < 1.0) & (uint)(fVar3 + -1.0) |
                   (uint)fVar3 & -(uint)(fVar3 < 1.0));
    fVar4 = (float)(~-(uint)(fVar4 < 1.0) & (uint)(fVar4 + -1.0) |
                   (uint)fVar4 & -(uint)(fVar4 < 1.0));
    uVar5 = CONCAT44((uint)(fVar4 + 1.0) & -(uint)(fVar4 < 0.0),
                     (uint)(fVar3 + 1.0) & -(uint)(fVar3 < 0.0)) |
            CONCAT44(~-(uint)(fVar4 < 0.0) & (uint)fVar4,~-(uint)(fVar3 < 0.0) & (uint)fVar3);
    this->offsetX = (float)(int)uVar5;
    this->offsetY = (float)(int)(uVar5 >> 0x20);
    fVar3 = this->rotate * diff + this->rotation;
    fVar3 = (float)(~-(uint)(360.0 < fVar3) & (uint)fVar3 |
                   (uint)(fVar3 + -360.0) & -(uint)(360.0 < fVar3));
    this->rotation =
         (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar3 | (uint)(fVar3 + 360.0) & -(uint)(fVar3 < 0.0))
    ;
    this = this->layerMask;
  } while (this != (FShaderLayer *)0x0);
  return;
}

Assistant:

void FShaderLayer::Update(float diff)
{
	r.Update(diff);
	g.Update(diff);
	b.Update(diff);
	alpha.Update(diff);
	vectorY.Update(diff);
	vectorX.Update(diff);
	scaleX.Update(diff);
	scaleY.Update(diff);
	adjustX.Update(diff);
	adjustY.Update(diff);
	srcFactor.Update(diff);
	dstFactor.Update(diff);

	offsetX += vectorX * diff;
	if (offsetX >= 1.f) offsetX -= 1.f;
	if (offsetX < 0.f) offsetX += 1.f;

	offsetY += vectorY * diff;
	if (offsetY >= 1.f) offsetY -= 1.f;
	if (offsetY < 0.f) offsetY += 1.f;

	rotation += rotate * diff;
	if (rotation > 360.f) rotation -= 360.f;
	if (rotation < 0.f) rotation += 360.f;

	if (layerMask != NULL) layerMask->Update(diff);
}